

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::IO_Report_PDU::IO_Report_PDU
          (IO_Report_PDU *this,EntityIdentifier *OrigID,KUINT16 SimSrc,IOReportType RT,
          EntityIdentifier *AtkID,EntityIdentifier *TgtID)

{
  KUINT16 KVar1;
  
  IO_Header::IO_Header(&this->super_IO_Header,OrigID);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Report_PDU_002246e0;
  this->m_ui16SimSrc = SimSrc;
  this->m_ui8RptTyp = (KUINT8)RT;
  (this->m_AtkEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (AtkID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_AtkEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (AtkID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_AtkEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_AtkEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_AtkEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(AtkID->super_SimulationIdentifier).field_0xc;
  (this->m_TgtEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (TgtID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_TgtEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (TgtID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_TgtEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_TgtEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_TgtEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(TgtID->super_SimulationIdentifier).field_0xc;
  this->m_ui32Padding = 0;
  this->m_ui16NumStdVarRec = 0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IO_Header).super_Header.super_Header6.m_ui8PDUType = 'G';
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

IO_Report_PDU::IO_Report_PDU( const EntityIdentifier & OrigID, KUINT16 SimSrc, IOReportType RT, const EntityIdentifier & AtkID, const EntityIdentifier & TgtID ) :
    IO_Header( OrigID ),
    m_ui16SimSrc( SimSrc ),
    m_ui8RptTyp( RT ),
    m_ui32Padding( 0 ),
    m_AtkEntityID( AtkID ),
    m_TgtEntityID( TgtID ),
    m_ui16NumStdVarRec( 0 )
{
    m_ui8PDUType = IO_Report_PDU_Type;
    m_ui16PDULength = IO_REPORT_PDU_SIZE;
}